

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O1

void ApprovalTests::SystemUtils::makeDirectoryForWindows(string *directory)

{
  return;
}

Assistant:

void SystemUtils::makeDirectoryForWindows(const std::string& directory)
    {
        APPROVAL_TESTS_UNUSED(directory);
#ifdef _WIN32
        int nError = _mkdir(directory.c_str());
        if (nError != 0)
        {
            std::string helpMessage =
                std::string("Unable to create directory: ") + directory;
            throw std::runtime_error(helpMessage);
        }
#endif
    }